

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZDICT_trainFromBuffer_legacy
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_legacy_params_t params)

{
  size_t __n;
  void *__dest;
  size_t *in_RCX;
  void *in_RDX;
  uint in_R8D;
  size_t sBuffSize;
  void *newBuff;
  size_t result;
  size_t in_stack_00000060;
  void *in_stack_00000068;
  undefined1 in_stack_00000080 [16];
  undefined8 local_8;
  
  __n = ZDICT_totalSampleSize(in_RCX,in_R8D);
  if (__n < 0x200) {
    local_8 = 0;
  }
  else {
    __dest = malloc(__n + 0x20);
    if (__dest == (void *)0x0) {
      local_8 = 0xffffffffffffffc0;
    }
    else {
      memcpy(__dest,in_RDX,__n);
      ZDICT_fillNoise((void *)((long)__dest + __n),0x20);
      local_8 = ZDICT_trainFromBuffer_unsafe_legacy
                          (in_stack_00000068,in_stack_00000060,dictBuffer,
                           (size_t *)dictBufferCapacity,samplesBuffer._4_4_,
                           (ZDICT_legacy_params_t)in_stack_00000080);
      free(__dest);
    }
  }
  return local_8;
}

Assistant:

size_t ZDICT_trainFromBuffer_legacy(void* dictBuffer, size_t dictBufferCapacity,
                              const void* samplesBuffer, const size_t* samplesSizes, unsigned nbSamples,
                              ZDICT_legacy_params_t params)
{
    size_t result;
    void* newBuff;
    size_t const sBuffSize = ZDICT_totalSampleSize(samplesSizes, nbSamples);
    if (sBuffSize < ZDICT_MIN_SAMPLES_SIZE) return 0;   /* not enough content => no dictionary */

    newBuff = malloc(sBuffSize + NOISELENGTH);
    if (!newBuff) return ERROR(memory_allocation);

    memcpy(newBuff, samplesBuffer, sBuffSize);
    ZDICT_fillNoise((char*)newBuff + sBuffSize, NOISELENGTH);   /* guard band, for end of buffer condition */

    result =
        ZDICT_trainFromBuffer_unsafe_legacy(dictBuffer, dictBufferCapacity, newBuff,
                                            samplesSizes, nbSamples, params);
    free(newBuff);
    return result;
}